

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O0

NativeDisplayFactory *
eglu::selectNativeDisplayFactory(NativeDisplayFactoryRegistry *registry,CommandLine *cmdLine)

{
  char *cmdLineArg;
  NativeDisplayFactory *pNVar1;
  CommandLine *cmdLine_local;
  NativeDisplayFactoryRegistry *registry_local;
  
  cmdLineArg = tcu::CommandLine::getEGLDisplayType(cmdLine);
  pNVar1 = selectFactory<eglu::NativeDisplayFactory>(registry,"display",cmdLineArg);
  return pNVar1;
}

Assistant:

const NativeDisplayFactory& selectNativeDisplayFactory (const NativeDisplayFactoryRegistry& registry, const tcu::CommandLine& cmdLine)
{
	return selectFactory(registry, "display", cmdLine.getEGLDisplayType());
}